

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

string * FormatParagraph_abi_cxx11_
                   (string *__return_storage_ptr__,string_view in,size_t width,size_t indent)

{
  size_type sVar1;
  ostream *poVar2;
  ulong __pos;
  ulong uVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view in_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  stringstream out;
  ostream local_1b0 [376];
  long local_38;
  
  in_local._M_str = in._M_str;
  uVar3 = in._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  in_local._M_len = uVar3;
  if (width < indent) {
    __assert_fail("width >= indent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/strencodings.cpp"
                  ,0x100,"std::string FormatParagraph(std::string_view, size_t, size_t)");
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  sVar4 = 0;
  __pos = 0;
  do {
    if (uVar3 <= __pos) {
LAB_00369c4d:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&in_local,'\n',__pos);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = in_local._M_len;
    }
    if (width - sVar4 < sVar1 - __pos) {
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                        (&in_local," \n",(width - sVar4) + __pos);
      if ((sVar1 == 0xffffffffffffffff || sVar1 < __pos) &&
         (sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            (&in_local,"\n ",__pos), sVar1 == 0xffffffffffffffff)) {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&in_local,__pos,0xffffffffffffffff);
        std::__ostream_insert<char,std::char_traits<char>>(local_1b0,bVar5._M_str,bVar5._M_len);
        goto LAB_00369c4d;
      }
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&in_local,__pos,sVar1 - __pos);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1b0,bVar5._M_str,bVar5._M_len);
      std::operator<<(poVar2,"\n");
      if (in_local._M_str[sVar1] == '\n') {
        sVar4 = 0;
      }
      if (in_local._M_str[sVar1] != '\n' && indent != 0) {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_1e0,indent,' ');
        std::operator<<(local_1b0,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        sVar4 = indent;
      }
    }
    else {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&in_local,__pos,(sVar1 - __pos) + 1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0,bVar5._M_str,bVar5._M_len);
      sVar4 = 0;
    }
    __pos = sVar1 + 1;
    uVar3 = in_local._M_len;
  } while( true );
}

Assistant:

std::string FormatParagraph(std::string_view in, size_t width, size_t indent)
{
    assert(width >= indent);
    std::stringstream out;
    size_t ptr = 0;
    size_t indented = 0;
    while (ptr < in.size())
    {
        size_t lineend = in.find_first_of('\n', ptr);
        if (lineend == std::string::npos) {
            lineend = in.size();
        }
        const size_t linelen = lineend - ptr;
        const size_t rem_width = width - indented;
        if (linelen <= rem_width) {
            out << in.substr(ptr, linelen + 1);
            ptr = lineend + 1;
            indented = 0;
        } else {
            size_t finalspace = in.find_last_of(" \n", ptr + rem_width);
            if (finalspace == std::string::npos || finalspace < ptr) {
                // No place to break; just include the entire word and move on
                finalspace = in.find_first_of("\n ", ptr);
                if (finalspace == std::string::npos) {
                    // End of the string, just add it and break
                    out << in.substr(ptr);
                    break;
                }
            }
            out << in.substr(ptr, finalspace - ptr) << "\n";
            if (in[finalspace] == '\n') {
                indented = 0;
            } else if (indent) {
                out << std::string(indent, ' ');
                indented = indent;
            }
            ptr = finalspace + 1;
        }
    }
    return out.str();
}